

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightconf_sample.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  ulong uVar4;
  size_t sVar5;
  size_type sVar6;
  reference pvVar7;
  ostream *poVar8;
  return_type<std::__cxx11::basic_string<char>_> psVar9;
  reference ppVar10;
  size_t __nbytes;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  config_format local_818 [32];
  long local_7f8;
  ofstream stream;
  path local_5f8;
  reference local_5e0;
  permission *p_1;
  const_iterator __end6;
  const_iterator __begin6;
  vector<permission,_std::allocator<permission>_> *__range6;
  person *x_1;
  iterator __end5;
  iterator __begin5;
  vector<person,_std::allocator<person>_> *__range5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  path local_578;
  person *local_560;
  __normal_iterator<person_*,_std::vector<person,_std::allocator<person>_>_> local_558;
  __normal_iterator<person_*,_std::vector<person,_std::allocator<person>_>_> local_550;
  const_iterator local_548;
  uint local_540;
  int local_53c;
  uint i_1;
  int uid;
  person *x;
  iterator __end3;
  iterator __begin3;
  vector<person,_std::allocator<person>_> *__range3;
  string local_510 [36];
  value_type local_4ec [4];
  uint local_4dc;
  undefined1 local_4d8 [4];
  uint i;
  person p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  path local_440;
  vector<person,_std::allocator<person>_> local_428;
  path local_410;
  undefined1 local_3f8 [8];
  vector<person,_std::allocator<person>_> users;
  undefined1 local_3d8 [8];
  string command;
  parse_error *e;
  exception *e_1;
  group local_358;
  allocator<char> local_309;
  undefined1 local_308 [12];
  undefined1 local_2f8 [12];
  string local_2e8 [32];
  long local_2c8;
  ifstream stream_1;
  allocator local_b9;
  string local_b8 [8];
  string source;
  group config_group;
  allocator local_39;
  string local_38 [8];
  string filename;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  filename.field_2._8_8_ = argv;
  if (argc < 2) {
    usage();
    argv_local._4_4_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"users.config",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    lightconf::group::group((group *)((long)&source.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"",&local_b9);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::ifstream::ifstream(&local_2c8,local_38,_S_in);
    bVar3 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&local_2c8 + *(long *)(local_2c8 + -0x18)));
    if (bVar3) {
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_2f8,
                 (istream_type *)&local_2c8);
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_308);
      std::allocator<char>::allocator();
      __beg._12_4_ = 0;
      __beg._M_sbuf = (streambuf_type *)local_2f8._0_8_;
      __beg._M_c = local_2f8._8_4_;
      __end._12_4_ = 0;
      __end._M_sbuf = (streambuf_type *)local_308._0_8_;
      __end._M_c = local_308._8_4_;
      std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                (local_2e8,__beg,__end,&local_309);
      std::__cxx11::string::operator=(local_b8,local_2e8);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator(&local_309);
      lightconf::config_format::read((int)&local_358,local_b8,__nbytes);
      lightconf::group::operator=((group *)((long)&source.field_2 + 8),&local_358);
      lightconf::group::~group(&local_358);
    }
    else {
      lightconf::group::group((group *)&e_1);
      lightconf::group::operator=((group *)((long)&source.field_2 + 8),(group *)&e_1);
      lightconf::group::~group((group *)&e_1);
    }
    std::ifstream::~ifstream(&local_2c8);
    pcVar2 = *(char **)(filename.field_2._8_8_ + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_3d8,pcVar2,
               (allocator *)
               ((long)&users.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&users.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    lightconf::path::path(&local_410,"users",'.');
    local_428.super__Vector_base<person,_std::allocator<person>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_428.super__Vector_base<person,_std::allocator<person>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_428.super__Vector_base<person,_std::allocator<person>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<person,_std::allocator<person>_>::vector(&local_428);
    lightconf::group::get<std::vector<person,std::allocator<person>>>
              ((return_type<std::vector<person>_> *)local_3f8,(group *)((long)&source.field_2 + 8),
               &local_410,&local_428);
    std::vector<person,_std::allocator<person>_>::~vector(&local_428);
    lightconf::path::~path(&local_410);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_3d8,"setmaintainer");
    if (bVar3) {
      if (argc != 3) {
        argfail();
      }
      lightconf::path::path(&local_440,"global.maintainer",'.');
      pcVar2 = *(char **)(filename.field_2._8_8_ + 0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_460,pcVar2,(allocator *)&p.field_0x6f);
      lightconf::group::set<std::__cxx11::string>
                ((group *)((long)&source.field_2 + 8),&local_440,&local_460);
      std::__cxx11::string::~string((string *)&local_460);
      std::allocator<char>::~allocator((allocator<char> *)&p.field_0x6f);
      lightconf::path::~path(&local_440);
      poVar8 = std::operator<<((ostream *)&std::cout,"Maintainer set to ");
      poVar8 = std::operator<<(poVar8,*(char **)(filename.field_2._8_8_ + 0x10));
      std::operator<<(poVar8,".\n");
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_3d8,"adduser");
      if (bVar3) {
        if (argc != 9) {
          argfail();
        }
        person::person((person *)local_4d8);
        local_4d8 = (undefined1  [4])atoi(*(char **)(filename.field_2._8_8_ + 0x10));
        std::__cxx11::string::operator=((string *)&p,*(char **)(filename.field_2._8_8_ + 0x18));
        std::__cxx11::string::operator=
                  ((string *)(p.firstname.field_2._M_local_buf + 8),
                   *(char **)(filename.field_2._8_8_ + 0x20));
        for (local_4dc = 0; uVar4 = (ulong)local_4dc,
            sVar5 = strlen(*(char **)(filename.field_2._8_8_ + 0x28)), uVar4 < sVar5;
            local_4dc = local_4dc + 1) {
          if (*(char *)(*(long *)(filename.field_2._8_8_ + 0x28) + (ulong)local_4dc) == 'R') {
            local_4ec[3] = 0;
            std::vector<permission,_std::allocator<permission>_>::push_back
                      ((vector<permission,_std::allocator<permission>_> *)
                       ((long)&p.lastname.field_2 + 8),local_4ec + 3);
          }
          else if (*(char *)(*(long *)(filename.field_2._8_8_ + 0x28) + (ulong)local_4dc) == 'C') {
            local_4ec[2] = 1;
            std::vector<permission,_std::allocator<permission>_>::push_back
                      ((vector<permission,_std::allocator<permission>_> *)
                       ((long)&p.lastname.field_2 + 8),local_4ec + 2);
          }
          else if (*(char *)(*(long *)(filename.field_2._8_8_ + 0x28) + (ulong)local_4dc) == 'U') {
            local_4ec[1] = 3;
            std::vector<permission,_std::allocator<permission>_>::push_back
                      ((vector<permission,_std::allocator<permission>_> *)
                       ((long)&p.lastname.field_2 + 8),local_4ec + 1);
          }
          else if (*(char *)(*(long *)(filename.field_2._8_8_ + 0x28) + (ulong)local_4dc) == 'D') {
            local_4ec[0] = DELETE;
            std::vector<permission,_std::allocator<permission>_>::push_back
                      ((vector<permission,_std::allocator<permission>_> *)
                       ((long)&p.lastname.field_2 + 8),local_4ec);
          }
          else {
            poVar8 = std::operator<<((ostream *)&std::cout,"Unknown permission letter: ");
            cVar1 = *(char *)(*(long *)(filename.field_2._8_8_ + 0x28) + (ulong)local_4dc);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_510,1,cVar1,(allocator *)((long)&__range3 + 7));
            poVar8 = std::operator<<(poVar8,local_510);
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string(local_510);
            std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
          }
        }
        p.perms.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             atoi(*(char **)(filename.field_2._8_8_ + 0x30));
        p.perms.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             atoi(*(char **)(filename.field_2._8_8_ + 0x38));
        p.joindate.month = atoi(*(char **)(filename.field_2._8_8_ + 0x40));
        if ((p.perms.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ < 1) ||
           (0x1f < p.perms.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_)) {
          std::operator<<((ostream *)&std::cout,"Day out of range [1-31], adjusted to 1.\n");
          p.perms.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        }
        if (((int)p.perms.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage < 1) ||
           (0xc < (int)p.perms.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)) {
          std::operator<<((ostream *)&std::cout,"Month out of range [1-12], adjusted to 1.\n");
          p.perms.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        if ((p.joindate.month < 0x7b2) || (0x833 < p.joindate.month)) {
          std::operator<<((ostream *)&std::cout,"Year out of range [1970-2099], adjusted to 1970.\n"
                         );
          p.joindate.month = 0x7b2;
        }
        __end3 = std::vector<person,_std::allocator<person>_>::begin
                           ((vector<person,_std::allocator<person>_> *)local_3f8);
        x = (person *)
            std::vector<person,_std::allocator<person>_>::end
                      ((vector<person,_std::allocator<person>_> *)local_3f8);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<person_*,_std::vector<person,_std::allocator<person>_>_>
                                           *)&x), bVar3) {
          _i_1 = __gnu_cxx::
                 __normal_iterator<person_*,_std::vector<person,_std::allocator<person>_>_>::
                 operator*(&__end3);
          if ((undefined1  [4])_i_1->userid == local_4d8) {
            std::operator<<((ostream *)&std::cout,"User id already exists.\n");
            goto LAB_0012708f;
          }
          __gnu_cxx::__normal_iterator<person_*,_std::vector<person,_std::allocator<person>_>_>::
          operator++(&__end3);
        }
        std::vector<person,_std::allocator<person>_>::push_back
                  ((vector<person,_std::allocator<person>_> *)local_3f8,(value_type *)local_4d8);
        std::operator<<((ostream *)&std::cout,"User added.\n");
LAB_0012708f:
        person::~person((person *)local_4d8);
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_3d8,"deluser");
        if (bVar3) {
          if (argc != 3) {
            argfail();
          }
          local_53c = atoi(*(char **)(filename.field_2._8_8_ + 0x10));
          for (local_540 = 0; uVar4 = (ulong)local_540,
              sVar6 = std::vector<person,_std::allocator<person>_>::size
                                ((vector<person,_std::allocator<person>_> *)local_3f8),
              uVar4 < sVar6; local_540 = local_540 + 1) {
            pvVar7 = std::vector<person,_std::allocator<person>_>::operator[]
                               ((vector<person,_std::allocator<person>_> *)local_3f8,
                                (ulong)local_540);
            if (pvVar7->userid == local_53c) {
              local_558._M_current =
                   (person *)
                   std::begin<std::vector<person,std::allocator<person>>>
                             ((vector<person,_std::allocator<person>_> *)local_3f8);
              local_550 = __gnu_cxx::
                          __normal_iterator<person_*,_std::vector<person,_std::allocator<person>_>_>
                          ::operator+(&local_558,(ulong)local_540);
              __gnu_cxx::__normal_iterator<person_const*,std::vector<person,std::allocator<person>>>
              ::__normal_iterator<person*>
                        ((__normal_iterator<person_const*,std::vector<person,std::allocator<person>>>
                          *)&local_548,&local_550);
              local_560 = (person *)
                          std::vector<person,_std::allocator<person>_>::erase
                                    ((vector<person,_std::allocator<person>_> *)local_3f8,local_548)
              ;
              std::operator<<((ostream *)&std::cout,"User deleted.\n");
              goto LAB_001276fa;
            }
          }
          std::operator<<((ostream *)&std::cout,"User not found.\n");
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_3d8,"print");
          if (bVar3) {
            poVar8 = std::operator<<((ostream *)&std::cout,"Maintainer: ");
            lightconf::path::path(&local_578,"global.maintainer",'.');
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_598,"<not set>",(allocator *)((long)&__range5 + 7));
            psVar9 = lightconf::group::get<std::__cxx11::string>
                               ((group *)((long)&source.field_2 + 8),&local_578,&local_598);
            poVar8 = std::operator<<(poVar8,(string *)psVar9);
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string((string *)&local_598);
            std::allocator<char>::~allocator((allocator<char> *)((long)&__range5 + 7));
            lightconf::path::~path(&local_578);
            std::operator<<((ostream *)&std::cout,"Users:\n");
            __end5 = std::vector<person,_std::allocator<person>_>::begin
                               ((vector<person,_std::allocator<person>_> *)local_3f8);
            x_1 = (person *)
                  std::vector<person,_std::allocator<person>_>::end
                            ((vector<person,_std::allocator<person>_> *)local_3f8);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end5,(__normal_iterator<person_*,_std::vector<person,_std::allocator<person>_>_>
                                               *)&x_1), bVar3) {
              ppVar10 = __gnu_cxx::
                        __normal_iterator<person_*,_std::vector<person,_std::allocator<person>_>_>::
                        operator*(&__end5);
              poVar8 = std::operator<<((ostream *)&std::cout,"    name:        ");
              poVar8 = std::operator<<(poVar8,(string *)&ppVar10->firstname);
              poVar8 = std::operator<<(poVar8," ");
              poVar8 = std::operator<<(poVar8,(string *)&ppVar10->lastname);
              std::operator<<(poVar8,"\n");
              poVar8 = std::operator<<((ostream *)&std::cout,"    uid:         ");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,ppVar10->userid);
              std::operator<<(poVar8,"\n");
              std::operator<<((ostream *)&std::cout,"    permissions: ");
              __end6 = std::vector<permission,_std::allocator<permission>_>::begin(&ppVar10->perms);
              p_1 = (permission *)
                    std::vector<permission,_std::allocator<permission>_>::end(&ppVar10->perms);
              while (bVar3 = __gnu_cxx::operator!=
                                       (&__end6,(__normal_iterator<const_permission_*,_std::vector<permission,_std::allocator<permission>_>_>
                                                 *)&p_1), bVar3) {
                local_5e0 = __gnu_cxx::
                            __normal_iterator<const_permission_*,_std::vector<permission,_std::allocator<permission>_>_>
                            ::operator*(&__end6);
                if (*local_5e0 == READ) {
                  std::operator<<((ostream *)&std::cout,"read ");
                }
                else if (*local_5e0 == CREATE) {
                  std::operator<<((ostream *)&std::cout,"create ");
                }
                else if (*local_5e0 == UPDATE) {
                  std::operator<<((ostream *)&std::cout,"update ");
                }
                else if (*local_5e0 == DELETE) {
                  std::operator<<((ostream *)&std::cout,"delete ");
                }
                __gnu_cxx::
                __normal_iterator<const_permission_*,_std::vector<permission,_std::allocator<permission>_>_>
                ::operator++(&__end6);
              }
              std::operator<<((ostream *)&std::cout,"\n");
              poVar8 = std::operator<<((ostream *)&std::cout,"    join date:   ");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ppVar10->joindate).month);
              poVar8 = std::operator<<(poVar8,"/");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ppVar10->joindate).day);
              poVar8 = std::operator<<(poVar8,"/");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ppVar10->joindate).year);
              std::operator<<(poVar8,"\n");
              std::operator<<((ostream *)&std::cout,"\n");
              __gnu_cxx::__normal_iterator<person_*,_std::vector<person,_std::allocator<person>_>_>
              ::operator++(&__end5);
            }
          }
        }
      }
    }
LAB_001276fa:
    lightconf::path::path(&local_5f8,"users",'.');
    lightconf::group::set<std::vector<person,std::allocator<person>>>
              ((group *)((long)&source.field_2 + 8),&local_5f8,
               (vector<person,_std::allocator<person>_> *)local_3f8);
    lightconf::path::~path(&local_5f8);
    std::ofstream::ofstream(&local_7f8,local_38,_S_out);
    bVar3 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&local_7f8 + *(long *)(local_7f8 + -0x18)));
    if (bVar3) {
      lightconf::config_format::write(local_818,(int)&source + 0x18,local_b8,0x50);
      std::operator<<((ostream *)&local_7f8,(string *)local_818);
      std::__cxx11::string::~string((string *)local_818);
      std::operator<<((ostream *)&std::cout,"Configuration saved.");
    }
    std::ofstream::~ofstream(&local_7f8);
    std::vector<person,_std::allocator<person>_>::~vector
              ((vector<person,_std::allocator<person>_> *)local_3f8);
    std::__cxx11::string::~string((string *)local_3d8);
    std::__cxx11::string::~string(local_b8);
    lightconf::group::~group((group *)((long)&source.field_2 + 8));
    std::__cxx11::string::~string(local_38);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc < 2) {
        usage();
        return 1;
    }

    std::string filename = "users.config";
    lightconf::group config_group;
    std::string source = "";
    try {
        std::ifstream stream(filename, std::ios::in);
        if (stream) {
            // If the file exists, load the configuration group from it
            source = std::string(std::istreambuf_iterator<char>(stream),
                std::istreambuf_iterator<char>());
            config_group = lightconf::config_format::read(source);
        } else {
            // If the file does not exist, just create an empty group
            config_group = lightconf::group();
        }
    } catch (const lightconf::parse_error& e) {
        std::cout << "Parse error (" << e.line() << ":" << e.col() << "): " << e.what();
        return 1;
    } catch (const std::exception& e) {
        std::cout << "Failed to read configuration file: " << e.what();
        return 1;
    }

    std::string command(argv[1]);
    std::vector<person> users = config_group.get<std::vector<person>>("users", {});

    if (command == "setmaintainer") {
        if (argc != 3) argfail();

        // Keys can be specified using full paths, and nonexistant parent groups will
        // be automatically created.
        config_group.set<std::string>("global.maintainer", argv[2]);
        std::cout << "Maintainer set to " << argv[2] << ".\n";
    } else if (command == "adduser") {
        if (argc != 9) argfail();
        person p;
        p.userid = atoi(argv[2]);
        p.firstname = argv[3];
        p.lastname = argv[4];
        for (unsigned int i = 0; i < strlen(argv[5]); i++) {
            if (argv[5][i] == 'R') p.perms.push_back(permission::READ);
            else if (argv[5][i] == 'C') p.perms.push_back(permission::CREATE);
            else if (argv[5][i] == 'U') p.perms.push_back(permission::UPDATE);
            else if (argv[5][i] == 'D') p.perms.push_back(permission::DELETE);
            else std::cout << "Unknown permission letter: " << std::string(1, argv[5][i]) << "\n";
        }
        p.joindate.day = atoi(argv[6]);
        p.joindate.month = atoi(argv[7]);
        p.joindate.year = atoi(argv[8]);

        if (p.joindate.day < 1 || p.joindate.day > 31) {
            std::cout << "Day out of range [1-31], adjusted to 1.\n";
            p.joindate.day = 1;
        }
        if (p.joindate.month < 1 || p.joindate.month > 12) {
            std::cout << "Month out of range [1-12], adjusted to 1.\n";
            p.joindate.month = 1;
        }
        if (p.joindate.year < 1970 || p.joindate.year > 2099) {
            std::cout << "Year out of range [1970-2099], adjusted to 1970.\n";
            p.joindate.year = 1970;
        }

        for (const auto& x : users) {
            if (x.userid == p.userid) {
                std::cout << "User id already exists.\n";
                goto save;
            }
        }
        users.push_back(p);
        std::cout << "User added.\n";
    } else if (command == "deluser") {
        if (argc != 3) argfail();
        int uid = atoi(argv[2]);
        for (unsigned int i = 0; i < users.size(); i++) {
            if (users[i].userid == uid) {
                users.erase(std::begin(users) + i);
                std::cout << "User deleted.\n";
                goto save;
            }
        }
        std::cout << "User not found.\n";
    } else if (command == "print") {
        std::cout << "Maintainer: "
            << config_group.get<std::string>("global.maintainer", "<not set>") << "\n";
        std::cout << "Users:\n";
        for (const auto& x : users) {
            std::cout << "    name:        " << x.firstname << " " << x.lastname << "\n";
            std::cout << "    uid:         " << x.userid << "\n";
            std::cout << "    permissions: ";
            for (const auto& p : x.perms) {
                if (p == permission::READ) std::cout << "read ";
                else if (p == permission::CREATE) std::cout << "create ";
                else if (p == permission::UPDATE) std::cout << "update ";
                else if (p == permission::DELETE) std::cout << "delete ";
            }
            std::cout << "\n";
            std::cout << "    join date:   " << x.joindate.month << "/"
                << x.joindate.day << "/" << x.joindate.year << "\n";
            std::cout << "\n";
        }
    }

save:
    config_group.set<std::vector<person>>("users", users);
    std::ofstream stream(filename, std::ios::out);
    if (stream) {
        stream << lightconf::config_format::write(config_group, source, 80);
        std::cout << "Configuration saved.";
    }
}